

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void get_extension(char *file_name,char *extension)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  __int32_t **pp_Var4;
  long lVar5;
  char *pcVar6;
  
  sVar2 = strlen(file_name);
  if (file_name <= file_name + (sVar2 - 1)) {
    pcVar6 = file_name + sVar2;
    if (file_name[sVar2 - 1] == '.') {
      lVar5 = 0;
    }
    else {
      lVar3 = -2;
      lVar5 = 0;
      do {
        pcVar1 = pcVar6 + lVar3;
        if (pcVar1 < file_name) goto LAB_001095c0;
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + -1;
      } while (*pcVar1 != '.');
      pcVar6 = pcVar6 + -lVar5;
    }
    if (lVar5 != 0) {
      lVar3 = 0;
      pp_Var4 = __ctype_tolower_loc();
      do {
        extension[lVar3] = (char)(*pp_Var4)[pcVar6[lVar3]];
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
    }
    extension = extension + lVar5;
  }
LAB_001095c0:
  *extension = '\0';
  return;
}

Assistant:

static void get_extension(const char *file_name, char *extension)
{
    size_t length = strlen(file_name);
    size_t ext_len = 0;
    size_t i = 0;
    const char *p = file_name + length - 1;

    while (p >= file_name) {
        if (p[0] == '.') {
            for (i = 0; i < ext_len; i++)
                extension[i] = tolower(p[i + 1]);

            extension[i] = '\0';
            return ;
        }
        ext_len++;
        p--;
    }

    extension[0] = '\0';
}